

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
libcellml::Parser::ParserImpl::loadUnit(ParserImpl *this,UnitsPtr *units,XmlNodePtr *node)

{
  IssueImpl *pIVar1;
  bool bVar2;
  bool bVar3;
  string *psVar4;
  XmlAttributePtr attribute;
  IssuePtr issue_2;
  IssuePtr issue_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string textNode;
  XmlNodePtr childNode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  double multiplier;
  double exponent;
  string id;
  string reference;
  string prefix;
  
  reference._M_dataplus._M_p = (pointer)&reference.field_2;
  reference._M_string_length = 0;
  reference.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&prefix,"0",(allocator<char> *)&id);
  id._M_dataplus._M_p = (pointer)&id.field_2;
  id._M_string_length = 0;
  exponent = 1.0;
  multiplier = 1.0;
  id.field_2._M_local_buf[0] = '\0';
  XmlNode::firstChild((XmlNode *)&childNode);
  while (childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0) {
    bVar2 = XmlNode::isText(childNode.
                            super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
    if (bVar2) {
      XmlNode::convertToString_abi_cxx11_
                (&textNode,
                 childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                );
      bVar2 = hasNonWhitespaceCharacters(&textNode);
      if (bVar2) {
        Issue::IssueImpl::create();
        pIVar1 = (IssueImpl *)
                 attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr[1].mPimpl;
        XmlNode::attribute_abi_cxx11_
                  (&local_150,
                   (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                   ,"units");
        std::operator+(&local_130,"Unit referencing \'",&local_150);
        std::operator+(&local_e0,&local_130,"\' in units \'");
        NamedEntity::name_abi_cxx11_
                  (&local_170,
                   &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->super_NamedEntity);
        std::operator+(&local_1b0,&local_e0,&local_170);
        std::operator+(&local_c0,&local_1b0,"\' has an invalid non-whitespace child text element \'"
                      );
        std::operator+(&local_190,&local_c0,&textNode);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_7
                       ,&local_190,"\'.");
        Issue::IssueImpl::setDescription
                  (pIVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &issue_7);
        std::__cxx11::string::~string((string *)&issue_7);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_150);
        AnyCellmlElement::AnyCellmlElementImpl::setUnits
                  ((AnyCellmlElementImpl *)
                   (attribute.
                    super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    [1].mPimpl[5].mXmlAttributePtr)->_private,units);
        Issue::IssueImpl::setReferenceRule
                  ((IssueImpl *)
                   attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr[1].mPimpl,XML_UNEXPECTED_CHARACTER);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&attribute);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&attribute.
                    super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      std::__cxx11::string::~string((string *)&textNode);
    }
    else {
      bVar2 = XmlNode::isComment(childNode.
                                 super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
      if (!bVar2) {
        Issue::IssueImpl::create();
        pIVar1 = (IssueImpl *)
                 attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr[1].mPimpl;
        XmlNode::attribute_abi_cxx11_
                  (&local_130,
                   (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                   ,"units");
        std::operator+(&local_e0,"Unit referencing \'",&local_130);
        std::operator+(&local_1b0,&local_e0,"\' in units \'");
        NamedEntity::name_abi_cxx11_
                  (&local_150,
                   &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->super_NamedEntity);
        std::operator+(&local_c0,&local_1b0,&local_150);
        std::operator+(&local_190,&local_c0,"\' has an invalid child element \'");
        XmlNode::name_abi_cxx11_
                  (&local_170,
                   childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_7
                       ,&local_190,&local_170);
        std::operator+(&textNode,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_7
                       ,"\'.");
        Issue::IssueImpl::setDescription(pIVar1,&textNode);
        std::__cxx11::string::~string((string *)&textNode);
        std::__cxx11::string::~string((string *)&issue_7);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_130);
        AnyCellmlElement::AnyCellmlElementImpl::setUnits
                  ((AnyCellmlElementImpl *)
                   (attribute.
                    super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    [1].mPimpl[5].mXmlAttributePtr)->_private,units);
        Issue::IssueImpl::setReferenceRule
                  ((IssueImpl *)
                   attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr[1].mPimpl,XML_UNEXPECTED_ELEMENT);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&attribute);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&attribute.
                    super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
    }
    XmlNode::next((XmlNode *)&textNode);
    std::__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> *)&textNode);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&textNode._M_string_length);
  }
  XmlNode::firstAttribute((XmlNode *)&attribute);
  bVar2 = false;
  do {
    if (attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (!bVar2) {
        Issue::IssueImpl::create();
        pIVar1 = (issue_7.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&textNode,"Unit does not specify a units attribute.",
                   (allocator<char> *)&local_190);
        Issue::IssueImpl::setDescription(pIVar1,&textNode);
        std::__cxx11::string::~string((string *)&textNode);
        AnyCellmlElement::AnyCellmlElementImpl::setUnits
                  ((((issue_7.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl->mItem).
                    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl,units);
        Issue::IssueImpl::setReferenceRule
                  ((issue_7.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->mPimpl,UNIT_UNITS);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_7);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&issue_7.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      Units::addUnit((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,&reference,&prefix,exponent,multiplier,&id);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string((string *)&id);
      std::__cxx11::string::~string((string *)&prefix);
      std::__cxx11::string::~string((string *)&reference);
      return;
    }
    bVar3 = XmlAttribute::isType
                      (attribute.
                       super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,"units","");
    if (bVar3) {
      if (this->mParsing1XVersion == true) {
        XmlAttribute::value_abi_cxx11_
                  ((string *)&issue_7,
                   attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        convertNonSiUnits(&textNode,(string *)&issue_7);
        std::__cxx11::string::operator=((string *)&reference,(string *)&textNode);
        std::__cxx11::string::~string((string *)&textNode);
        psVar4 = (string *)&issue_7;
      }
      else {
        XmlAttribute::value_abi_cxx11_
                  (&textNode,
                   attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        std::__cxx11::string::operator=((string *)&reference,(string *)&textNode);
        psVar4 = &textNode;
      }
      std::__cxx11::string::~string((string *)psVar4);
      bVar2 = true;
    }
    else {
      bVar3 = XmlAttribute::isType
                        (attribute.
                         super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,"prefix","");
      if (bVar3) {
        XmlAttribute::value_abi_cxx11_
                  (&textNode,
                   attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        psVar4 = &prefix;
LAB_00202e65:
        std::__cxx11::string::operator=((string *)psVar4,(string *)&textNode);
        std::__cxx11::string::~string((string *)&textNode);
      }
      else {
        bVar3 = XmlAttribute::isType
                          (attribute.
                           super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,"exponent","");
        if (bVar3) {
          XmlAttribute::value_abi_cxx11_
                    (&textNode,
                     attribute.
                     super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          bVar3 = isCellMLReal(&textNode);
          std::__cxx11::string::~string((string *)&textNode);
          if (bVar3) {
            XmlAttribute::value_abi_cxx11_
                      (&textNode,
                       attribute.
                       super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            bVar3 = convertToDouble(&textNode,&exponent);
            std::__cxx11::string::~string((string *)&textNode);
            if (bVar3) goto LAB_002037a7;
            Issue::IssueImpl::create();
            pIVar1 = (issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl;
            XmlNode::attribute_abi_cxx11_
                      (&local_130,
                       (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr,"units");
            std::operator+(&local_e0,"Unit referencing \'",&local_130);
            std::operator+(&local_1b0,&local_e0,"\' in units \'");
            NamedEntity::name_abi_cxx11_
                      (&local_150,
                       &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->super_NamedEntity);
            std::operator+(&local_c0,&local_1b0,&local_150);
            std::operator+(&local_190,&local_c0,"\' has an exponent with the value \'");
            XmlAttribute::value_abi_cxx11_
                      (&local_170,
                       attribute.
                       super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &issue_7,&local_190,&local_170);
            std::operator+(&textNode,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &issue_7,
                           "\' that is a representation of a CellML real valued number, but out of range of the \'double\' type."
                          );
            Issue::IssueImpl::setDescription(pIVar1,&textNode);
            std::__cxx11::string::~string((string *)&textNode);
            std::__cxx11::string::~string((string *)&issue_7);
            std::__cxx11::string::~string((string *)&local_170);
            std::__cxx11::string::~string((string *)&local_190);
            std::__cxx11::string::~string((string *)&local_c0);
            std::__cxx11::string::~string((string *)&local_150);
            std::__cxx11::string::~string((string *)&local_1b0);
            std::__cxx11::string::~string((string *)&local_e0);
            std::__cxx11::string::~string((string *)&local_130);
            AnyCellmlElement::AnyCellmlElementImpl::setUnits
                      ((((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl->mItem).
                        super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,units);
            Issue::IssueImpl::setReferenceRule
                      ((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,UNIT_ATTRIBUTE_EXPONENT_VALUE);
            Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_2);
          }
          else {
            Issue::IssueImpl::create();
            pIVar1 = (issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl;
            XmlNode::attribute_abi_cxx11_
                      (&local_130,
                       (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr,"units");
            std::operator+(&local_e0,"Unit referencing \'",&local_130);
            std::operator+(&local_1b0,&local_e0,"\' in units \'");
            NamedEntity::name_abi_cxx11_
                      (&local_150,
                       &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->super_NamedEntity);
            std::operator+(&local_c0,&local_1b0,&local_150);
            std::operator+(&local_190,&local_c0,"\' has an exponent with the value \'");
            XmlAttribute::value_abi_cxx11_
                      (&local_170,
                       attribute.
                       super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &issue_7,&local_190,&local_170);
            std::operator+(&textNode,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &issue_7,
                           "\' that is not a representation of a CellML real valued number.");
            Issue::IssueImpl::setDescription(pIVar1,&textNode);
            std::__cxx11::string::~string((string *)&textNode);
            std::__cxx11::string::~string((string *)&issue_7);
            std::__cxx11::string::~string((string *)&local_170);
            std::__cxx11::string::~string((string *)&local_190);
            std::__cxx11::string::~string((string *)&local_c0);
            std::__cxx11::string::~string((string *)&local_150);
            std::__cxx11::string::~string((string *)&local_1b0);
            std::__cxx11::string::~string((string *)&local_e0);
            std::__cxx11::string::~string((string *)&local_130);
            AnyCellmlElement::AnyCellmlElementImpl::setUnits
                      ((((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl->mItem).
                        super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,units);
            Issue::IssueImpl::setReferenceRule
                      ((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,UNIT_ATTRIBUTE_EXPONENT_VALUE);
            Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_2);
          }
        }
        else {
          bVar3 = XmlAttribute::isType
                            (attribute.
                             super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,"multiplier","");
          if (bVar3) {
            XmlAttribute::value_abi_cxx11_
                      (&textNode,
                       attribute.
                       super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            bVar3 = isCellMLReal(&textNode);
            std::__cxx11::string::~string((string *)&textNode);
            if (bVar3) {
              XmlAttribute::value_abi_cxx11_
                        (&textNode,
                         attribute.
                         super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
              bVar3 = convertToDouble(&textNode,&multiplier);
              std::__cxx11::string::~string((string *)&textNode);
              if (bVar3) goto LAB_002037a7;
              Issue::IssueImpl::create();
              pIVar1 = (issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl;
              XmlNode::attribute_abi_cxx11_
                        (&local_130,
                         (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr,"units");
              std::operator+(&local_e0,"Unit referencing \'",&local_130);
              std::operator+(&local_1b0,&local_e0,"\' in units \'");
              NamedEntity::name_abi_cxx11_
                        (&local_150,
                         &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)
                          ._M_ptr)->super_NamedEntity);
              std::operator+(&local_c0,&local_1b0,&local_150);
              std::operator+(&local_190,&local_c0,"\' has a multiplier with the value \'");
              XmlAttribute::value_abi_cxx11_
                        (&local_170,
                         attribute.
                         super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &issue_7,&local_190,&local_170);
              std::operator+(&textNode,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &issue_7,
                             "\' that is a representation of a CellML real valued number, but out of range of the \'double\' type."
                            );
              Issue::IssueImpl::setDescription(pIVar1,&textNode);
              std::__cxx11::string::~string((string *)&textNode);
              std::__cxx11::string::~string((string *)&issue_7);
              std::__cxx11::string::~string((string *)&local_170);
              std::__cxx11::string::~string((string *)&local_190);
              std::__cxx11::string::~string((string *)&local_c0);
              std::__cxx11::string::~string((string *)&local_150);
              std::__cxx11::string::~string((string *)&local_1b0);
              std::__cxx11::string::~string((string *)&local_e0);
              std::__cxx11::string::~string((string *)&local_130);
              AnyCellmlElement::AnyCellmlElementImpl::setUnits
                        ((((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->mPimpl->mItem).
                          super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl,units);
              Issue::IssueImpl::setReferenceRule
                        ((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl,UNIT_ATTRIBUTE_MULTIPLIER_VALUE);
              Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_2);
            }
            else {
              Issue::IssueImpl::create();
              pIVar1 = (issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl;
              XmlNode::attribute_abi_cxx11_
                        (&local_130,
                         (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr,"units");
              std::operator+(&local_e0,"Unit referencing \'",&local_130);
              std::operator+(&local_1b0,&local_e0,"\' in units \'");
              NamedEntity::name_abi_cxx11_
                        (&local_150,
                         &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)
                          ._M_ptr)->super_NamedEntity);
              std::operator+(&local_c0,&local_1b0,&local_150);
              std::operator+(&local_190,&local_c0,"\' has a multiplier with the value \'");
              XmlAttribute::value_abi_cxx11_
                        (&local_170,
                         attribute.
                         super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &issue_7,&local_190,&local_170);
              std::operator+(&textNode,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &issue_7,
                             "\' that is not a representation of a CellML real valued number.");
              Issue::IssueImpl::setDescription(pIVar1,&textNode);
              std::__cxx11::string::~string((string *)&textNode);
              std::__cxx11::string::~string((string *)&issue_7);
              std::__cxx11::string::~string((string *)&local_170);
              std::__cxx11::string::~string((string *)&local_190);
              std::__cxx11::string::~string((string *)&local_c0);
              std::__cxx11::string::~string((string *)&local_150);
              std::__cxx11::string::~string((string *)&local_1b0);
              std::__cxx11::string::~string((string *)&local_e0);
              std::__cxx11::string::~string((string *)&local_130);
              AnyCellmlElement::AnyCellmlElementImpl::setUnits
                        ((((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->mPimpl->mItem).
                          super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl,units);
              Issue::IssueImpl::setReferenceRule
                        ((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl,UNIT_ATTRIBUTE_MULTIPLIER_VALUE);
              Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_2);
            }
          }
          else {
            bVar3 = isIdAttribute(&attribute,this->mParsing1XVersion);
            if (bVar3) {
              XmlAttribute::value_abi_cxx11_
                        (&textNode,
                         attribute.
                         super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
              psVar4 = &id;
              goto LAB_00202e65;
            }
            Issue::IssueImpl::create();
            pIVar1 = (issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl;
            XmlNode::attribute_abi_cxx11_
                      (&local_130,
                       (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr,"units");
            std::operator+(&local_e0,"Unit referencing \'",&local_130);
            std::operator+(&local_1b0,&local_e0,"\' in units \'");
            NamedEntity::name_abi_cxx11_
                      (&local_150,
                       &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->super_NamedEntity);
            std::operator+(&local_c0,&local_1b0,&local_150);
            std::operator+(&local_190,&local_c0,"\' has an invalid attribute \'");
            XmlAttribute::name_abi_cxx11_
                      (&local_170,
                       attribute.
                       super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &issue_7,&local_190,&local_170);
            std::operator+(&textNode,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &issue_7,"\'.");
            Issue::IssueImpl::setDescription(pIVar1,&textNode);
            std::__cxx11::string::~string((string *)&textNode);
            std::__cxx11::string::~string((string *)&issue_7);
            std::__cxx11::string::~string((string *)&local_170);
            std::__cxx11::string::~string((string *)&local_190);
            std::__cxx11::string::~string((string *)&local_c0);
            std::__cxx11::string::~string((string *)&local_150);
            std::__cxx11::string::~string((string *)&local_1b0);
            std::__cxx11::string::~string((string *)&local_e0);
            std::__cxx11::string::~string((string *)&local_130);
            AnyCellmlElement::AnyCellmlElementImpl::setUnits
                      ((((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl->mItem).
                        super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,units);
            Issue::IssueImpl::setReferenceRule
                      ((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,UNIT_ATTRIBUTE_OPTIONAL);
            Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_2);
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
    }
LAB_002037a7:
    XmlAttribute::next((XmlAttribute *)&textNode);
    std::__shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2> *)&textNode);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&textNode._M_string_length);
  } while( true );
}

Assistant:

void Parser::ParserImpl::loadUnit(const UnitsPtr &units, const XmlNodePtr &node)
{
    std::string reference;
    std::string prefix = "0";
    double exponent = 1.0;
    double multiplier = 1.0;
    std::string id;
    // A unit should not have any children.
    XmlNodePtr childNode = node->firstChild();
    while (childNode != nullptr) {
        if (childNode->isText()) {
            std::string textNode = childNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Unit referencing '" + node->attribute("units") + "' in units '" + units->name() + "' has an invalid non-whitespace child text element '" + textNode + "'.");
                issue->mPimpl->mItem->mPimpl->setUnits(units);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            }
        } else if (childNode->isComment()) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Unit referencing '" + node->attribute("units") + "' in units '" + units->name() + "' has an invalid child element '" + childNode->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setUnits(units);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_ELEMENT);
            addIssue(issue);
        }
        childNode = childNode->next();
    }
    // Parse the unit attributes.
    XmlAttributePtr attribute = node->firstAttribute();
    bool unitsAttributePresent = false;
    while (attribute != nullptr) {
        if (attribute->isType("units")) {
            if (mParsing1XVersion) {
                reference = convertNonSiUnits(attribute->value());
            } else {
                reference = attribute->value();
            }
            unitsAttributePresent = true;
        } else if (attribute->isType("prefix")) {
            prefix = attribute->value();
        } else if (attribute->isType("exponent")) {
            if (isCellMLReal(attribute->value())) {
                if (!convertToDouble(attribute->value(), exponent)) {
                    // This value won't be saved for validation later, so it does need to be reported now.
                    auto issue = Issue::IssueImpl::create();
                    issue->mPimpl->setDescription("Unit referencing '" + node->attribute("units") + "' in units '" + units->name() + "' has an exponent with the value '" + attribute->value() + "' that is a representation of a CellML real valued number, but out of range of the 'double' type.");
                    issue->mPimpl->mItem->mPimpl->setUnits(units);
                    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNIT_ATTRIBUTE_EXPONENT_VALUE);
                    addIssue(issue);
                }
            } else {
                // This value won't be saved for validation later, so it does need to be reported now.
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Unit referencing '" + node->attribute("units") + "' in units '" + units->name() + "' has an exponent with the value '" + attribute->value() + "' that is not a representation of a CellML real valued number.");
                issue->mPimpl->mItem->mPimpl->setUnits(units);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNIT_ATTRIBUTE_EXPONENT_VALUE);
                addIssue(issue);
            }
        } else if (attribute->isType("multiplier")) {
            if (isCellMLReal(attribute->value())) {
                if (!convertToDouble(attribute->value(), multiplier)) {
                    // This value won't be saved for validation later, so it does need to be reported now.
                    auto issue = Issue::IssueImpl::create();
                    issue->mPimpl->setDescription("Unit referencing '" + node->attribute("units") + "' in units '" + units->name() + "' has a multiplier with the value '" + attribute->value() + "' that is a representation of a CellML real valued number, but out of range of the 'double' type.");
                    issue->mPimpl->mItem->mPimpl->setUnits(units);
                    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNIT_ATTRIBUTE_MULTIPLIER_VALUE);
                    addIssue(issue);
                }
            } else {
                // This value won't be saved for validation later, so it does need to be reported now.
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Unit referencing '" + node->attribute("units") + "' in units '" + units->name() + "' has a multiplier with the value '" + attribute->value() + "' that is not a representation of a CellML real valued number.");
                issue->mPimpl->mItem->mPimpl->setUnits(units);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNIT_ATTRIBUTE_MULTIPLIER_VALUE);
                addIssue(issue);
            }
        } else if (isIdAttribute(attribute, mParsing1XVersion)) {
            id = attribute->value();
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Unit referencing '" + node->attribute("units") + "' in units '" + units->name() + "' has an invalid attribute '" + attribute->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setUnits(units);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNIT_ATTRIBUTE_OPTIONAL);
            addIssue(issue);
        }
        attribute = attribute->next();
    }

    if (!unitsAttributePresent) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Unit does not specify a units attribute.");
        issue->mPimpl->mItem->mPimpl->setUnits(units);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNIT_UNITS);
        addIssue(issue);
    }

    // Add this unit to the parent units.
    units->addUnit(reference, prefix, exponent, multiplier, id);
}